

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

void __thiscall
testing::anon_unknown_6::MockObjectRegistry::~MockObjectRegistry(MockObjectRegistry *this)

{
  int iVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  int in_ECX;
  int iVar4;
  _Link_type in_RSI;
  char *pcVar5;
  string local_50;
  
  if (FLAGS_gmock_catch_leaked_mocks == '\x01') {
    iVar4 = 0;
    for (p_Var3 = (this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->states_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      if (*(char *)&p_Var3[3]._M_right == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        internal::FormatFileLocation_abi_cxx11_
                  (&local_50,(internal *)p_Var3[1]._M_parent,
                   (char *)(ulong)*(uint *)&p_Var3[1]._M_left,in_ECX);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," ERROR: this mock object",0x18);
        iVar1 = std::__cxx11::string::compare((char *)&p_Var3[2]._M_right);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," (used in test ",0xf);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)p_Var3[1]._M_right,*(long *)(p_Var3 + 2)
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,(char *)p_Var3[2]._M_right,*(long *)(p_Var3 + 3));
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," should be deleted but never is. Its address is @",0x31);
        poVar2 = std::ostream::_M_insert<void_const*>(&std::cout);
        in_RSI = (_Link_type)0x308d56;
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
        iVar4 = iVar4 + 1;
      }
    }
    if (0 < iVar4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nERROR: ",8);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," leaked mock ",0xd);
      pcVar5 = "objects";
      if (iVar4 == 1) {
        pcVar5 = "object";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,(ulong)(iVar4 == 1) ^ 7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,
                 " found at program exit. Expectations on a mock object are verified when the object is destructed. Leaking a mock means that its expectations aren\'t verified, which is usually a test bug. If you really intend to leak a mock, you can suppress this error using testing::Mock::AllowLeak(mock_object), or you may use a fake or stub instead of a mock.\n"
                 ,0x15a);
      std::ostream::flush();
      std::ostream::flush();
      _exit(1);
    }
  }
  std::
  _Rb_tree<const_void_*,_std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>,_std::_Select1st<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  ::_M_erase((_Rb_tree<const_void_*,_std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>,_std::_Select1st<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
              *)(this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,in_RSI);
  return;
}

Assistant:

~MockObjectRegistry() {
    if (!GMOCK_FLAG(catch_leaked_mocks))
      return;

    int leaked_count = 0;
    for (StateMap::const_iterator it = states_.begin(); it != states_.end();
         ++it) {
      if (it->second.leakable)  // The user said it's fine to leak this object.
        continue;

      // FIXME: Print the type of the leaked object.
      // This can help the user identify the leaked object.
      std::cout << "\n";
      const MockObjectState& state = it->second;
      std::cout << internal::FormatFileLocation(state.first_used_file,
                                                state.first_used_line);
      std::cout << " ERROR: this mock object";
      if (state.first_used_test != "") {
        std::cout << " (used in test " << state.first_used_test_suite << "."
                  << state.first_used_test << ")";
      }
      std::cout << " should be deleted but never is. Its address is @"
           << it->first << ".";
      leaked_count++;
    }
    if (leaked_count > 0) {
      std::cout << "\nERROR: " << leaked_count << " leaked mock "
                << (leaked_count == 1 ? "object" : "objects")
                << " found at program exit. Expectations on a mock object are "
                   "verified when the object is destructed. Leaking a mock "
                   "means that its expectations aren't verified, which is "
                   "usually a test bug. If you really intend to leak a mock, "
                   "you can suppress this error using "
                   "testing::Mock::AllowLeak(mock_object), or you may use a "
                   "fake or stub instead of a mock.\n";
      std::cout.flush();
      ::std::cerr.flush();
      // RUN_ALL_TESTS() has already returned when this destructor is
      // called.  Therefore we cannot use the normal Google Test
      // failure reporting mechanism.
      _exit(1);  // We cannot call exit() as it is not reentrant and
                 // may already have been called.
    }
  }